

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookbehind_matcher.hpp
# Opt level: O0

void __thiscall
boost::xpressive::detail::
lookbehind_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::lookbehind_matcher
          (lookbehind_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *this,shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *xpr,size_t wid,bool no,bool pure)

{
  byte in_CL;
  matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  byte in_R8B;
  char *in_stack_00000048;
  error_type in_stack_00000050;
  bool in_stack_00000057;
  shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffb8;
  width local_28;
  byte local_1a;
  byte local_19;
  matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  
  local_19 = in_CL & 1;
  local_1a = in_R8B & 1;
  local_18 = in_RDX;
  shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::shared_matchable(in_RDI,in_stack_ffffffffffffffb8);
  *(byte *)&in_RDI[1].xpr_.px = local_19 & 1;
  *(byte *)((long)&in_RDI[1].xpr_.px + 1) = local_1a & 1;
  in_RDI[2].xpr_.px = local_18;
  detail::width::width(&local_28,(size_t)in_RDI[2].xpr_.px);
  is_unknown((width *)0x167f73);
  ensure_(in_stack_00000057,in_stack_00000050,in_stack_00000048,(char *)this,(char *)xpr,wid);
  return;
}

Assistant:

lookbehind_matcher(Xpr const &xpr, std::size_t wid, bool no, bool pure = Xpr::pure)
          : xpr_(xpr)
          , not_(no)
          , pure_(pure)
          , width_(wid)
        {
            BOOST_XPR_ENSURE_(!is_unknown(this->width_), regex_constants::error_badlookbehind,
                "Variable-width look-behind assertions are not supported");
        }